

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O1

int duckdb_brotli::BrotliEncoderCompressStream
              (BrotliEncoderStateInternal *s,BrotliEncoderOperation op,size_t *available_in,
              uint8_t **next_in,size_t *available_out,uint8_t **next_out,size_t *total_out)

{
  MemoryManager *m;
  anon_union_16_2_c961180f_for_tiny_buf_ *__dest;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  BrotliEncoderStreamState BVar4;
  size_t out_bytes;
  ulong uVar5;
  BrotliOnePassArena *pBVar6;
  BrotliTwoPassArena *pBVar7;
  ulong uVar8;
  uint32_t *puVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  int *table;
  uint64_t uVar12;
  byte bVar13;
  bool bVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  undefined8 *puVar23;
  ulong uVar24;
  uint8_t *puVar25;
  uint32_t uVar26;
  uint32_t uVar27;
  size_t n;
  uint uVar28;
  bool bVar29;
  byte bVar30;
  uint32_t *local_88;
  uint32_t *local_70;
  uint8_t *local_68;
  uint8_t *local_60;
  size_t storage_ix;
  uint8_t **local_50;
  ulong *local_48;
  uint local_40;
  BrotliEncoderStreamState local_3c;
  size_t local_38;
  byte bVar14;
  
  bVar30 = 0;
  m = &s->memory_manager_;
  if (s->is_initialized_ == 0) {
    s->last_bytes_ = 0;
    s->last_bytes_bits_ = '\0';
    s->flint_ = -2;
    s->remaining_metadata_bytes_ = 0xffffffff;
    iVar3 = (s->params).quality;
    iVar16 = 0;
    if (0 < iVar3) {
      iVar16 = iVar3;
    }
    iVar18 = 0xb;
    if (iVar16 < 0xb) {
      iVar18 = iVar16;
    }
    (s->params).quality = iVar18;
    if (iVar3 < 3) {
      (s->params).large_window = 0;
    }
    iVar16 = (s->params).lgwin;
    iVar18 = 10;
    if (iVar16 < 10) {
LAB_01d2fec7:
      (s->params).lgwin = iVar18;
    }
    else {
      iVar18 = 0x1e;
      if ((s->params).large_window == 0) {
        iVar18 = 0x18;
      }
      if (iVar18 < iVar16) goto LAB_01d2fec7;
    }
    if (iVar3 < 2) {
      iVar16 = (s->params).lgwin;
    }
    else {
      iVar16 = 0xe;
      if (3 < iVar3) {
        iVar16 = (s->params).lgblock;
        if (iVar16 == 0) {
          iVar16 = 0x10;
          if (((8 < iVar3) && (iVar18 = (s->params).lgwin, 0x10 < iVar18)) &&
             (iVar16 = 0x12, iVar18 < 0x12)) {
            iVar16 = iVar18;
          }
        }
        else {
          iVar18 = 0x10;
          if (0x10 < iVar16) {
            iVar18 = iVar16;
          }
          iVar16 = 0x18;
          if (iVar18 < 0x18) {
            iVar16 = iVar18;
          }
        }
      }
    }
    (s->params).lgblock = iVar16;
    if (iVar3 < 4) {
LAB_01d2ff59:
      uVar19 = 0;
      uVar22 = 0;
    }
    else {
      if ((s->params).mode == BROTLI_MODE_FONT) {
        uVar22 = 1;
        uVar19 = 0xc;
      }
      else {
        uVar22 = (s->params).dist.distance_postfix_bits;
        uVar19 = (s->params).dist.num_direct_distance_codes;
      }
      if ((0x78 < uVar19 || 3 < uVar22) ||
         ((uVar19 >> ((byte)uVar22 & 0x1f) & 0xf) << ((byte)uVar22 & 0x1f) != uVar19))
      goto LAB_01d2ff59;
    }
    BrotliInitDistanceParams(&(s->params).dist,uVar22,uVar19,(s->params).large_window);
    uVar8 = (s->params).stream_offset;
    if (uVar8 != 0) {
      s->flint_ = '\x02';
      s->dist_cache_[0] = -0x10;
      s->dist_cache_[1] = -0x10;
      s->dist_cache_[2] = -0x10;
      s->dist_cache_[3] = -0x10;
      uVar1 = *(undefined8 *)(s->dist_cache_ + 2);
      *(undefined8 *)s->saved_dist_cache_ = *(undefined8 *)s->dist_cache_;
      *(undefined8 *)(s->saved_dist_cache_ + 2) = uVar1;
    }
    uVar22 = (s->params).lgwin;
    iVar3 = (s->params).lgblock;
    bVar13 = (byte)iVar3;
    bVar14 = bVar13;
    if (iVar3 < (int)uVar22) {
      bVar14 = (byte)uVar22;
    }
    uVar26 = 1 << (bVar14 + 1 & 0x1f);
    uVar19 = (s->params).quality;
    uVar27 = 1 << (bVar13 & 0x1f);
    uVar28 = 0x12;
    if (0x12 < (int)uVar22) {
      uVar28 = uVar22;
    }
    if (1 < uVar19) {
      uVar28 = uVar22;
    }
    (s->ringbuffer_).size_ = uVar26;
    (s->ringbuffer_).mask_ = uVar26 - 1;
    (s->ringbuffer_).tail_size_ = uVar27;
    (s->ringbuffer_).total_size_ = uVar26 + uVar27;
    if (uVar8 == 0) {
      if ((s->params).large_window == 0) {
        if (uVar28 == 0x11) {
          s->last_bytes_ = 1;
LAB_01d3007a:
          s->last_bytes_bits_ = '\a';
        }
        else if (uVar28 == 0x10) {
          s->last_bytes_ = 0;
          s->last_bytes_bits_ = '\x01';
        }
        else {
          if ((int)uVar28 < 0x12) {
            s->last_bytes_ = (short)(uVar28 << 4) - 0x7f;
            goto LAB_01d3007a;
          }
          s->last_bytes_ = (short)uVar28 * 2 - 0x21;
          s->last_bytes_bits_ = '\x04';
        }
      }
      else {
        s->last_bytes_ = (ushort)((uVar28 & 0x3f) << 8) | 0x11;
        s->last_bytes_bits_ = '\x0e';
      }
    }
    else {
      uVar5 = (1L << ((byte)uVar28 & 0x3f)) - 0x10;
      if (uVar8 < uVar5) {
        uVar5 = uVar8;
      }
      (s->params).stream_offset = uVar5;
    }
    if (uVar19 == 1) {
      pBVar7 = (BrotliTwoPassArena *)BrotliAllocate(m,0x1dc8);
      s->two_pass_arena_ = pBVar7;
    }
    else if (uVar19 == 0) {
      pBVar6 = (BrotliOnePassArena *)BrotliAllocate(m,0x1fd0);
      s->one_pass_arena_ = pBVar6;
      puVar23 = &InitCommandPrefixCodes(duckdb_brotli::BrotliOnePassArena*)::kDefaultCommandDepths;
      puVar10 = pBVar6->cmd_depth;
      for (lVar17 = 0x10; lVar17 != 0; lVar17 = lVar17 + -1) {
        *(undefined8 *)puVar10 = *puVar23;
        puVar23 = puVar23 + (ulong)bVar30 * -2 + 1;
        puVar10 = puVar10 + (ulong)bVar30 * -0x10 + 8;
      }
      switchD_012dd528::default
                (pBVar6->cmd_bits,
                 InitCommandPrefixCodes(duckdb_brotli::BrotliOnePassArena*)::kDefaultCommandBits,
                 0x100);
      pBVar6->cmd_code[0] = 0xff;
      pBVar6->cmd_code[1] = 'w';
      pBVar6->cmd_code[2] = 0xd5;
      pBVar6->cmd_code[3] = 0xbf;
      pBVar6->cmd_code[4] = 0xe7;
      pBVar6->cmd_code[5] = 0xde;
      pBVar6->cmd_code[6] = 0xea;
      pBVar6->cmd_code[7] = 0x9e;
      pBVar6->cmd_code[8] = 'Q';
      pBVar6->cmd_code[9] = ']';
      pBVar6->cmd_code[10] = 0xde;
      pBVar6->cmd_code[0xb] = 0xc6;
      pBVar6->cmd_code[0xc] = 'p';
      pBVar6->cmd_code[0xd] = 'W';
      pBVar6->cmd_code[0xe] = 0xbc;
      pBVar6->cmd_code[0xf] = 'X';
      pBVar6->cmd_code[0x10] = 'X';
      pBVar6->cmd_code[0x11] = 'X';
      pBVar6->cmd_code[0x12] = 0xd8;
      pBVar6->cmd_code[0x13] = 0xd8;
      pBVar6->cmd_code[0x14] = 'X';
      pBVar6->cmd_code[0x15] = 0xd5;
      pBVar6->cmd_code[0x16] = 0xcb;
      pBVar6->cmd_code[0x17] = 0x8c;
      pBVar6->cmd_code[0x18] = 0xea;
      pBVar6->cmd_code[0x19] = 0xe0;
      pBVar6->cmd_code[0x1a] = 0xc3;
      pBVar6->cmd_code[0x1b] = 0x87;
      pBVar6->cmd_code[0x1c] = '\x1f';
      pBVar6->cmd_code[0x1d] = 0x83;
      pBVar6->cmd_code[0x1e] = 0xc1;
      pBVar6->cmd_code[0x1f] = '`';
      pBVar6->cmd_code[0x20] = '\x1c';
      pBVar6->cmd_code[0x21] = 'g';
      pBVar6->cmd_code[0x22] = 0xb2;
      pBVar6->cmd_code[0x23] = 0xaa;
      pBVar6->cmd_code[0x24] = '\x06';
      pBVar6->cmd_code[0x25] = 0x83;
      pBVar6->cmd_code[0x26] = 0xc1;
      pBVar6->cmd_code[0x27] = '`';
      pBVar6->cmd_code[0x28] = '0';
      pBVar6->cmd_code[0x29] = '\x18';
      pBVar6->cmd_code[0x2a] = 0xcc;
      pBVar6->cmd_code[0x2b] = 0xa1;
      pBVar6->cmd_code[0x2c] = 0xce;
      pBVar6->cmd_code[0x2d] = 0x88;
      pBVar6->cmd_code[0x2e] = 'T';
      pBVar6->cmd_code[0x2f] = 0x94;
      pBVar6->cmd_code[0x29] = '\x18';
      pBVar6->cmd_code[0x2a] = 0xcc;
      pBVar6->cmd_code[0x2b] = 0xa1;
      pBVar6->cmd_code[0x2c] = 0xce;
      pBVar6->cmd_code[0x2d] = 0x88;
      pBVar6->cmd_code[0x2e] = 'T';
      pBVar6->cmd_code[0x2f] = 0x94;
      pBVar6->cmd_code[0x30] = 'F';
      pBVar6->cmd_code[0x31] = 0xe1;
      pBVar6->cmd_code[0x32] = 0xb0;
      pBVar6->cmd_code[0x33] = 0xd0;
      pBVar6->cmd_code[0x34] = 'N';
      pBVar6->cmd_code[0x35] = 0xb2;
      pBVar6->cmd_code[0x36] = 0xf7;
      pBVar6->cmd_code[0x37] = '\x04';
      pBVar6->cmd_code[0x38] = '\0';
      pBVar6->cmd_code_numbits = 0x1c0;
    }
    s->is_initialized_ = 1;
  }
  if ((ulong)s->remaining_metadata_bytes_ != 0xffffffff) {
    if (op != BROTLI_OPERATION_EMIT_METADATA) {
      return 0;
    }
    if (*available_in != (ulong)s->remaining_metadata_bytes_) {
      return 0;
    }
LAB_01d3018b:
    if ((s->params).size_hint == 0) {
      uVar8 = s->input_pos_ - s->last_processed_pos_;
      if (0x3fffffff < uVar8) {
        uVar8 = 0x40000000;
      }
      (s->params).size_hint = uVar8;
    }
    if (*available_in < 0x1000001) {
      if (s->stream_state_ == BROTLI_STREAM_PROCESSING) {
        s->remaining_metadata_bytes_ = (uint32_t)*available_in;
        s->stream_state_ = BROTLI_STREAM_METADATA_HEAD;
      }
      if (s->stream_state_ - BROTLI_STREAM_METADATA_HEAD < 2) {
        __dest = &s->tiny_buf_;
        do {
          while( true ) {
            do {
              iVar3 = InjectFlushOrPushOutput(s,available_out,next_out,total_out);
            } while (iVar3 != 0);
            if (s->available_out_ != 0) {
              return 1;
            }
            if (s->input_pos_ != s->last_flush_pos_) break;
            if (s->stream_state_ == BROTLI_STREAM_METADATA_HEAD) {
              s->next_out_ = (uint8_t *)__dest;
              uVar22 = s->remaining_metadata_bytes_;
              uVar21 = (ulong)uVar22;
              bVar30 = s->last_bytes_bits_;
              uVar20 = (ulong)bVar30;
              *(uint16_t *)&s->tiny_buf_ = s->last_bytes_;
              s->last_bytes_ = 0;
              s->last_bytes_bits_ = '\0';
              *(ulong *)((long)&s->tiny_buf_ + (ulong)(bVar30 >> 3)) =
                   (ulong)(s->tiny_buf_).u8[bVar30 >> 3];
              uVar5 = uVar20 + 1 >> 3;
              uVar24 = (ulong)(bVar30 + 3 >> 3);
              uVar8 = uVar20 + 4;
              *(ulong *)((long)&s->tiny_buf_ + uVar5) =
                   3L << ((byte)(uVar20 + 1) & 7) | (ulong)(s->tiny_buf_).u8[uVar5];
              *(ulong *)((long)&s->tiny_buf_ + uVar24) = (ulong)(s->tiny_buf_).u8[uVar24];
              if (uVar21 == 1) {
LAB_01d30408:
                uVar5 = uVar20 + (ulong)uVar22 * 8;
                *(ulong *)((long)__dest + (uVar8 >> 3)) =
                     (ulong)uVar22 << ((byte)uVar8 & 7) | (ulong)__dest->u8[uVar8 >> 3];
                uVar8 = uVar20 + 6 >> 3;
                *(ulong *)((long)__dest + uVar8) =
                     uVar21 - 1 << ((byte)(uVar20 + 6) & 7) | (ulong)__dest->u8[uVar8];
              }
              else {
                if (uVar22 != 0) {
                  uVar19 = 0x1f;
                  if (uVar22 - 1 != 0) {
                    for (; uVar22 - 1 >> uVar19 == 0; uVar19 = uVar19 - 1) {
                    }
                  }
                  uVar22 = (uVar19 ^ 0xffffffe0) + 0x28 >> 3;
                  goto LAB_01d30408;
                }
                *(ulong *)((long)__dest + (uVar8 >> 3)) = (ulong)__dest->u8[uVar8 >> 3];
                uVar5 = uVar20;
              }
              s->available_out_ = uVar5 + 0xd >> 3;
              s->stream_state_ = BROTLI_STREAM_METADATA_BODY;
            }
            else {
              uVar22 = s->remaining_metadata_bytes_;
              uVar8 = (ulong)uVar22;
              if (uVar8 == 0) {
                s->remaining_metadata_bytes_ = 0xffffffff;
                s->stream_state_ = BROTLI_STREAM_PROCESSING;
                return 1;
              }
              uVar5 = *available_out;
              if (uVar5 == 0) {
                if (0xf < uVar22) {
                  uVar22 = 0x10;
                }
                uVar8 = (ulong)uVar22;
                s->next_out_ = (uint8_t *)__dest;
                switchD_012dd528::default(__dest,*next_in,uVar8);
                *next_in = *next_in + uVar8;
                *available_in = *available_in - uVar8;
                s->total_in_ = s->total_in_ + uVar8;
                s->remaining_metadata_bytes_ = s->remaining_metadata_bytes_ - uVar22;
                s->available_out_ = uVar8;
              }
              else {
                if (uVar8 < uVar5) {
                  uVar5 = uVar8;
                }
                switchD_012dd528::default(*next_out,*next_in,uVar5);
                *next_in = *next_in + uVar5;
                *available_in = *available_in - uVar5;
                s->total_in_ = s->total_in_ + uVar5;
                s->remaining_metadata_bytes_ = s->remaining_metadata_bytes_ - (int)uVar5;
                *next_out = *next_out + uVar5;
                *available_out = *available_out - uVar5;
              }
            }
          }
          iVar3 = EncodeData(s,0,1,&s->available_out_,&s->next_out_);
        } while (iVar3 != 0);
      }
    }
    return 0;
  }
  if (op == BROTLI_OPERATION_EMIT_METADATA) goto LAB_01d3018b;
  if (s->stream_state_ - BROTLI_STREAM_METADATA_HEAD < 2) {
    return 0;
  }
  if ((s->stream_state_ != BROTLI_STREAM_PROCESSING) && (*available_in != 0)) {
    return 0;
  }
  uVar22 = (s->params).quality;
  if (1 < uVar22) {
    local_50 = &s->next_out_;
    do {
      uVar5 = s->input_pos_ - s->last_processed_pos_;
      uVar21 = 1L << ((byte)(s->params).lgblock & 0x3f);
      uVar8 = uVar21 - uVar5;
      if (uVar21 < uVar5) {
        uVar8 = 0;
      }
      uVar21 = (ulong)s->flint_;
      uVar5 = uVar21;
      if (uVar8 < uVar21) {
        uVar5 = uVar8;
      }
      if ((long)uVar21 < 0) {
        uVar5 = uVar8;
      }
      if ((uVar5 == 0) || (uVar8 = *available_in, uVar8 == 0)) {
        iVar3 = InjectFlushOrPushOutput(s,available_out,next_out,total_out);
        if (iVar3 == 0) {
          iVar3 = 3;
          if (((s->available_out_ == 0) && (op != BROTLI_OPERATION_PROCESS || uVar5 == 0)) &&
             (s->stream_state_ == BROTLI_STREAM_PROCESSING)) {
            uVar8 = *available_in;
            bVar29 = uVar8 == 0;
            bVar15 = op == BROTLI_OPERATION_FINISH && bVar29;
            bVar2 = op == BROTLI_OPERATION_FLUSH && bVar29;
            if ((op != BROTLI_OPERATION_FINISH || !bVar29) && (s->flint_ == '\0')) {
              s->flint_ = -1;
              bVar2 = true;
            }
            if ((s->params).size_hint == 0) {
              uVar5 = s->input_pos_ - s->last_processed_pos_;
              uVar21 = uVar5 + uVar8;
              if (0x3fffffff < uVar21) {
                uVar21 = 0x40000000;
              }
              if (0x3fffffff < (uVar5 | uVar8)) {
                uVar21 = 0x40000000;
              }
              (s->params).size_hint = uVar21;
            }
            uVar22 = (uint)bVar15;
            iVar3 = EncodeData(s,uVar22,(uint)bVar2,&s->available_out_,local_50);
            if (iVar3 == 0) {
              iVar3 = 1;
            }
            else {
              iVar3 = 2;
              if ((bVar2 | bVar15) == 1) {
                s->stream_state_ = uVar22 + BROTLI_STREAM_FLUSH_REQUESTED;
              }
            }
          }
        }
        else {
          iVar3 = 2;
          if (s->flint_ == -1) {
            if ((s->stream_state_ == BROTLI_STREAM_FLUSH_REQUESTED) && (s->available_out_ == 0)) {
              s->stream_state_ = BROTLI_STREAM_PROCESSING;
              s->next_out_ = (uint8_t *)0x0;
            }
            if (s->stream_state_ == BROTLI_STREAM_PROCESSING) {
              s->flint_ = -2;
            }
          }
        }
      }
      else {
        if (uVar5 < uVar8) {
          uVar8 = uVar5;
        }
        puVar10 = *next_in;
        uVar22 = (uint)uVar8;
        if (((s->ringbuffer_).pos_ == 0) && (uVar8 < (s->ringbuffer_).tail_size_)) {
          (s->ringbuffer_).pos_ = uVar22;
          puVar11 = (uint8_t *)BrotliAllocate(m,(ulong)(uVar22 + 2) + 7);
          puVar25 = (s->ringbuffer_).data_;
          if (puVar25 != (uint8_t *)0x0) {
            switchD_012dd528::default(puVar11,puVar25,(ulong)((s->ringbuffer_).cur_size_ + 2) + 7);
            BrotliFree(m,(s->ringbuffer_).data_);
            (s->ringbuffer_).data_ = (uint8_t *)0x0;
          }
          (s->ringbuffer_).data_ = puVar11;
          (s->ringbuffer_).cur_size_ = uVar22;
          (s->ringbuffer_).buffer_ = puVar11 + 2;
          puVar11[1] = '\0';
          (s->ringbuffer_).buffer_[-2] = '\0';
          lVar17 = 0;
          do {
            (s->ringbuffer_).buffer_[lVar17 + (ulong)(s->ringbuffer_).cur_size_] = '\0';
            lVar17 = lVar17 + 1;
          } while (lVar17 != 7);
          switchD_012dd528::default((s->ringbuffer_).buffer_,puVar10,uVar8);
        }
        else {
          uVar19 = (s->ringbuffer_).total_size_;
          if ((s->ringbuffer_).cur_size_ < uVar19) {
            puVar11 = (uint8_t *)BrotliAllocate(m,(ulong)(uVar19 + 2) + 7);
            puVar25 = (s->ringbuffer_).data_;
            if (puVar25 != (uint8_t *)0x0) {
              switchD_012dd528::default(puVar11,puVar25,(ulong)((s->ringbuffer_).cur_size_ + 2) + 7)
              ;
              BrotliFree(m,(s->ringbuffer_).data_);
              (s->ringbuffer_).data_ = (uint8_t *)0x0;
            }
            (s->ringbuffer_).data_ = puVar11;
            (s->ringbuffer_).cur_size_ = uVar19;
            (s->ringbuffer_).buffer_ = puVar11 + 2;
            puVar11[1] = '\0';
            (s->ringbuffer_).buffer_[-2] = '\0';
            lVar17 = 0;
            do {
              (s->ringbuffer_).buffer_[lVar17 + (ulong)(s->ringbuffer_).cur_size_] = '\0';
              lVar17 = lVar17 + 1;
            } while (lVar17 != 7);
            (s->ringbuffer_).buffer_[(s->ringbuffer_).size_ - 2] = '\0';
            (s->ringbuffer_).buffer_[(s->ringbuffer_).size_ - 1] = '\0';
            (s->ringbuffer_).buffer_[(s->ringbuffer_).size_] = 0xf1;
          }
          uVar19 = (s->ringbuffer_).tail_size_;
          uVar28 = (s->ringbuffer_).mask_ & (s->ringbuffer_).pos_;
          uVar5 = (ulong)uVar28;
          if (uVar28 < uVar19) {
            uVar21 = uVar19 - uVar5;
            if (uVar8 < uVar21) {
              uVar21 = uVar8;
            }
            switchD_012dd528::default
                      ((s->ringbuffer_).buffer_ + uVar5 + (s->ringbuffer_).size_,puVar10,uVar21);
          }
          if ((ulong)(s->ringbuffer_).size_ < uVar5 + uVar8) {
            uVar21 = (s->ringbuffer_).total_size_ - uVar5;
            if (uVar8 < uVar21) {
              uVar21 = uVar8;
            }
            switchD_012dd528::default((s->ringbuffer_).buffer_ + uVar5,puVar10,uVar21);
            puVar25 = (s->ringbuffer_).buffer_;
            lVar17 = (s->ringbuffer_).size_ - uVar5;
            puVar10 = puVar10 + lVar17;
            uVar5 = uVar8 - lVar17;
          }
          else {
            puVar25 = (s->ringbuffer_).buffer_ + uVar5;
            uVar5 = uVar8;
          }
          switchD_012dd528::default(puVar25,puVar10,uVar5);
          puVar10 = (s->ringbuffer_).buffer_;
          uVar19 = (s->ringbuffer_).pos_;
          puVar10[-2] = puVar10[(s->ringbuffer_).size_ - 2];
          puVar10 = (s->ringbuffer_).buffer_;
          puVar10[-1] = puVar10[(s->ringbuffer_).size_ - 1];
          (s->ringbuffer_).pos_ =
               (uVar22 & 0x7fffffff) + ((s->ringbuffer_).pos_ & 0x7fffffff) | uVar19 & 0x80000000;
        }
        s->input_pos_ = s->input_pos_ + uVar8;
        uVar22 = (s->ringbuffer_).pos_;
        if (uVar22 <= (s->ringbuffer_).mask_) {
          puVar10 = (s->ringbuffer_).buffer_;
          puVar25 = puVar10 + (ulong)uVar22 + 3;
          puVar25[0] = '\0';
          puVar25[1] = '\0';
          puVar25[2] = '\0';
          puVar25[3] = '\0';
          puVar10 = puVar10 + uVar22;
          puVar10[0] = '\0';
          puVar10[1] = '\0';
          puVar10[2] = '\0';
          puVar10[3] = '\0';
        }
        *next_in = *next_in + uVar8;
        *available_in = *available_in - uVar8;
        s->total_in_ = s->total_in_ + uVar8;
        iVar3 = 2;
        if ('\0' < s->flint_) {
          s->flint_ = s->flint_ - (char)uVar8;
        }
      }
    } while (iVar3 == 2);
    if (iVar3 == 1) {
      return 0;
    }
    goto LAB_01d30d14;
  }
  uVar21 = 1L << ((byte)(s->params).lgwin & 0x3f);
  uVar8 = *available_in;
  uVar5 = uVar21;
  if (uVar8 < uVar21) {
    uVar5 = uVar8;
  }
  n = 0x20000;
  if (uVar5 < 0x20000) {
    n = uVar5;
  }
  if (uVar22 == 1) {
    if ((0x1ffff < uVar5) && (s->command_buf_ == (uint32_t *)0x0)) {
      puVar9 = (uint32_t *)BrotliAllocate(m,0x80000);
      s->command_buf_ = puVar9;
      puVar10 = (uint8_t *)BrotliAllocate(m,0x20000);
      s->literal_buf_ = puVar10;
    }
    local_88 = s->command_buf_;
    if (local_88 != (uint32_t *)0x0) {
      local_60 = s->literal_buf_;
      goto LAB_01d30a9f;
    }
    if (uVar8 == 0) {
      local_88 = (uint32_t *)0x0;
      local_60 = (uint8_t *)0x0;
    }
    else {
      local_88 = (uint32_t *)BrotliAllocate(m,n * 4);
      local_60 = (uint8_t *)BrotliAllocate(m,n);
    }
    local_70 = local_88;
    local_68 = local_60;
  }
  else {
    local_60 = (uint8_t *)0x0;
    local_88 = (uint32_t *)0x0;
LAB_01d30a9f:
    local_68 = (uint8_t *)0x0;
    local_70 = (uint32_t *)0x0;
  }
  local_40 = op - BROTLI_OPERATION_FLUSH;
  local_3c = (op == BROTLI_OPERATION_FINISH) + BROTLI_STREAM_FLUSH_REQUESTED;
  local_48 = available_in;
LAB_01d30ad2:
  do {
    iVar3 = InjectFlushOrPushOutput(s,available_out,next_out,total_out);
  } while (iVar3 != 0);
  if (((s->available_out_ == 0) && (s->stream_state_ == BROTLI_STREAM_PROCESSING)) &&
     (uVar8 = *available_in, op != BROTLI_OPERATION_PROCESS || uVar8 != 0)) {
    uVar5 = uVar8;
    if (uVar8 > uVar21) {
      uVar5 = uVar21;
    }
    storage_ix = (size_t)s->last_bytes_bits_;
    BVar4 = BROTLI_STREAM_FLUSH_REQUESTED;
    if (op != BROTLI_OPERATION_FLUSH || uVar8 != 0) goto code_r0x01d30b5c;
    goto LAB_01d30cd8;
  }
  BrotliFree(m,local_70);
  BrotliFree(m,local_68);
LAB_01d30d14:
  if (s->stream_state_ != BROTLI_STREAM_FLUSH_REQUESTED) {
    return 1;
  }
  if (s->available_out_ != 0) {
    return 1;
  }
  s->stream_state_ = BROTLI_STREAM_PROCESSING;
  s->next_out_ = (uint8_t *)0x0;
  return 1;
code_r0x01d30b5c:
  uVar20 = uVar5 * 2 + 0x1f7;
  local_50 = (uint8_t **)*available_out;
  if (local_50 < uVar20) {
    puVar10 = GetBrotliStorage(s,uVar20);
  }
  else {
    puVar10 = *next_out;
  }
  uVar22 = (uint)(op == BROTLI_OPERATION_FINISH && uVar8 <= uVar21);
  *puVar10 = (uint8_t)s->last_bytes_;
  puVar10[1] = *(uint8_t *)((long)&s->last_bytes_ + 1);
  table = GetHashTable(s,(s->params).quality,uVar5,&local_38);
  if ((s->params).quality == 0) {
    BrotliCompressFragmentFast
              (s->one_pass_arena_,*next_in,uVar5,uVar22,table,local_38,&storage_ix,puVar10);
  }
  else {
    BrotliCompressFragmentTwoPass
              (s->two_pass_arena_,*next_in,uVar5,uVar22,local_88,local_60,table,local_38,&storage_ix
               ,puVar10);
  }
  if (uVar8 != 0) {
    *next_in = *next_in + uVar5;
    *local_48 = *local_48 - uVar5;
    s->total_in_ = s->total_in_ + uVar5;
  }
  uVar5 = storage_ix >> 3;
  if (local_50 < uVar20) {
    s->next_out_ = puVar10;
    s->available_out_ = uVar5;
  }
  else {
    *next_out = *next_out + uVar5;
    *available_out = *available_out - uVar5;
    uVar12 = uVar5 + s->total_out_;
    s->total_out_ = uVar12;
    if (total_out != (size_t *)0x0) {
      *total_out = uVar12;
    }
  }
  s->last_bytes_ = (ushort)puVar10[storage_ix >> 3];
  s->last_bytes_bits_ = (byte)storage_ix & 7;
  available_in = local_48;
  BVar4 = local_3c;
  if (local_40 < 2 && uVar8 <= uVar21) {
LAB_01d30cd8:
    s->stream_state_ = BVar4;
    available_in = local_48;
  }
  goto LAB_01d30ad2;
}

Assistant:

BROTLI_BOOL duckdb_brotli::BrotliEncoderCompressStream(
    BrotliEncoderState* s, BrotliEncoderOperation op, size_t* available_in,
    const uint8_t** next_in, size_t* available_out, uint8_t** next_out,
    size_t* total_out) {
  if (!EnsureInitialized(s)) return BROTLI_FALSE;

  /* Unfinished metadata block; check requirements. */
  if (s->remaining_metadata_bytes_ != BROTLI_UINT32_MAX) {
    if (*available_in != s->remaining_metadata_bytes_) return BROTLI_FALSE;
    if (op != BROTLI_OPERATION_EMIT_METADATA) return BROTLI_FALSE;
  }

  if (op == BROTLI_OPERATION_EMIT_METADATA) {
    UpdateSizeHint(s, 0);  /* First data metablock might be emitted here. */
    return ProcessMetadata(
        s, available_in, next_in, available_out, next_out, total_out);
  }

  if (s->stream_state_ == BROTLI_STREAM_METADATA_HEAD ||
      s->stream_state_ == BROTLI_STREAM_METADATA_BODY) {
    return BROTLI_FALSE;
  }

  if (s->stream_state_ != BROTLI_STREAM_PROCESSING && *available_in != 0) {
    return BROTLI_FALSE;
  }
  if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
    return BrotliEncoderCompressStreamFast(s, op, available_in, next_in,
        available_out, next_out, total_out);
  }
  while (BROTLI_TRUE) {
    size_t remaining_block_size = RemainingInputBlockSize(s);
    /* Shorten input to flint size. */
    if (s->flint_ >= 0 && remaining_block_size > (size_t)s->flint_) {
      remaining_block_size = (size_t)s->flint_;
    }

    if (remaining_block_size != 0 && *available_in != 0) {
      size_t copy_input_size =
          BROTLI_MIN(size_t, remaining_block_size, *available_in);
      CopyInputToRingBuffer(s, copy_input_size, *next_in);
      *next_in += copy_input_size;
      *available_in -= copy_input_size;
      s->total_in_ += copy_input_size;
      if (s->flint_ > 0) s->flint_ = (int8_t)(s->flint_ - (int)copy_input_size);
      continue;
    }

    if (InjectFlushOrPushOutput(s, available_out, next_out, total_out)) {
      /* Exit the "emit flint" workflow. */
      if (s->flint_ == BROTLI_FLINT_WAITING_FOR_FLUSHING) {
        CheckFlushComplete(s);
        if (s->stream_state_ == BROTLI_STREAM_PROCESSING) {
          s->flint_ = BROTLI_FLINT_DONE;
        }
      }
      continue;
    }

    /* Compress data only when internal output buffer is empty, stream is not
       finished and there is no pending flush request. */
    if (s->available_out_ == 0 &&
        s->stream_state_ == BROTLI_STREAM_PROCESSING) {
      if (remaining_block_size == 0 || op != BROTLI_OPERATION_PROCESS) {
        BROTLI_BOOL is_last = TO_BROTLI_BOOL(
            (*available_in == 0) && op == BROTLI_OPERATION_FINISH);
        BROTLI_BOOL force_flush = TO_BROTLI_BOOL(
            (*available_in == 0) && op == BROTLI_OPERATION_FLUSH);
        BROTLI_BOOL result;
        /* Force emitting (uncompressed) piece containing flint. */
        if (!is_last && s->flint_ == 0) {
          s->flint_ = BROTLI_FLINT_WAITING_FOR_FLUSHING;
          force_flush = BROTLI_TRUE;
        }
        UpdateSizeHint(s, *available_in);
        result = EncodeData(s, is_last, force_flush,
            &s->available_out_, &s->next_out_);
        if (!result) return BROTLI_FALSE;
        if (force_flush) s->stream_state_ = BROTLI_STREAM_FLUSH_REQUESTED;
        if (is_last) s->stream_state_ = BROTLI_STREAM_FINISHED;
        continue;
      }
    }
    break;
  }
  CheckFlushComplete(s);
  return BROTLI_TRUE;
}